

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGasTerminalType::~IfcGasTerminalType
          (IfcGasTerminalType *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = pvVar1;
  *(void **)((long)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
                    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x3f];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x40];
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x42];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148
       = vtt[0x43];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x180 = vtt[0x44];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x190 = vtt[0x45];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.field_0x1a0 = vtt[0x46];
  *(void **)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0 =
       vtt[0x47];
  std::__cxx11::string::~string((string *)&(this->super_IfcFlowTerminalType).field_0x1c0);
  IfcElementType::~IfcElementType((IfcElementType *)this,vtt + 4);
  return;
}

Assistant:

IfcGasTerminalType() : Object("IfcGasTerminalType") {}